

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

double __thiscall ON_SurfaceCurvature::MaximumRadius(ON_SurfaceCurvature *this)

{
  int iVar1;
  int iVar2;
  ON_SurfaceCurvature *local_40;
  double local_38;
  double local_20;
  double k;
  ON_SurfaceCurvature *this_local;
  
  if ((((this->k1 <= -1.23432101234321e+308) ||
       (1.23432101234321e+308 < this->k1 || this->k1 == 1.23432101234321e+308)) ||
      (this->k2 <= -1.23432101234321e+308)) ||
     (1.23432101234321e+308 < this->k2 || this->k2 == 1.23432101234321e+308)) {
    this_local = (ON_SurfaceCurvature *)ON_DBL_QNAN;
  }
  else {
    iVar1 = ON_DBL::Sign(this->k1);
    iVar2 = ON_DBL::Sign(this->k2);
    if (((iVar1 * iVar2 < 1) || (ABS(this->k1) <= 1e-300)) || (ABS(this->k2) <= 1e-300)) {
      local_20 = 0.0;
    }
    else {
      if (ABS(this->k2) < ABS(this->k1)) {
        local_38 = this->k2;
      }
      else {
        local_38 = this->k1;
      }
      local_38 = ABS(local_38);
      local_20 = local_38;
    }
    if (local_20 <= 1e-300) {
      local_40 = (ON_SurfaceCurvature *)1e+300;
    }
    else {
      local_40 = (ON_SurfaceCurvature *)(1.0 / local_20);
    }
    this_local = local_40;
  }
  return (double)this_local;
}

Assistant:

double ON_SurfaceCurvature::MaximumRadius() const
{
  if (ON_IS_VALID(k1) && ON_IS_VALID(k2))
  {
    // k = minimum directional curvature
    double k;
    if (ON_DBL::Sign(k1)*ON_DBL::Sign(k2) <= 0 || fabs(k1) <= 1e-300 || fabs(k2) <= 1e-300)
    {
      // If principal curvatures have opposite signs,
      // there is a direction with zero directional curvature.
      k = 0.0;
    }
    else
    {
      // The minimum directional curvature is in a principal curvature direction.
      k = (fabs(k1) <= fabs(k2)) ? fabs(k1) : fabs(k2);
    }

    // 1/k = maximum radius of curvature
    return
      (k > (1.0 / ON_SurfaceCurvature::InfinteRadius))
      ? 1.0 / k 
      : ON_SurfaceCurvature::InfinteRadius; 
  }

  return ON_DBL_QNAN;
}